

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseMaps.h
# Opt level: O3

insert_result __thiscall
tonk::
LightHashMap<asio::ip::basic_endpoint<asio::ip::udp>,_tonk::IConnection_*,_tonk::UDPAddressHasher>::
insert(LightHashMap<asio::ip::basic_endpoint<asio::ip::udp>,_tonk::IConnection_*,_tonk::UDPAddressHasher>
       *this,basic_endpoint<asio::ip::udp> *k,IConnection **v)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  uint64_t uVar5;
  ulong uVar6;
  raw_node *e1;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  
  if (this->m_values_count == 0) {
LAB_00149f2d:
    uVar9 = this->m_values_count * 2;
    uVar7 = 4;
    if (4 < uVar9) {
      uVar7 = uVar9;
    }
    rehash(this,uVar7);
    if (this->m_values_count != 0) {
      uVar5 = HashUDPAddress(k);
      uVar9 = (uint)((int)uVar5 * -0x61c88647) >> ((byte)this->m_hash_shift & 0x1f);
      uVar8 = (ulong)uVar9;
      e1 = this->m_values + uVar8;
      if (this->m_values[uVar8].m_bits[0x28] != '\0') {
        bVar4 = asio::ip::operator==((basic_endpoint<asio::ip::udp> *)e1,k);
        if (bVar4) goto LAB_00149f8a;
        do {
          if ((int)uVar8 == 0) {
            uVar8 = (ulong)(this->m_values_count - 1);
            e1 = this->m_values + uVar8;
          }
          else {
            uVar8 = (ulong)((int)uVar8 - 1);
            e1 = e1 + -1;
          }
          uVar7 = (uint)uVar8;
          if (uVar9 == uVar7) goto LAB_0014a020;
          if (e1->m_bits[0x28] == '\0') goto LAB_00149fdc;
          bVar4 = asio::ip::operator==((basic_endpoint<asio::ip::udp> *)e1,k);
        } while (!bVar4);
        goto LAB_00149fd4;
      }
LAB_00149fdc:
      if (this->m_num_valid < this->m_grow_threshold) goto LAB_00149fe4;
    }
LAB_0014a020:
    uVar6 = 0;
    uVar8 = 0;
  }
  else {
    uVar5 = HashUDPAddress(k);
    uVar9 = (uint)((int)uVar5 * -0x61c88647) >> ((byte)this->m_hash_shift & 0x1f);
    uVar8 = (ulong)uVar9;
    e1 = this->m_values + uVar8;
    if (this->m_values[uVar8].m_bits[0x28] == '\0') {
LAB_00149f21:
      if (this->m_grow_threshold <= this->m_num_valid) goto LAB_00149f2d;
LAB_00149fe4:
      uVar1 = *(undefined8 *)&(k->impl_).data_;
      uVar2 = *(undefined8 *)((long)&(k->impl_).data_ + 8);
      uVar3 = *(undefined8 *)((long)&(k->impl_).data_ + 0x14);
      uVar6 = 0x100000000;
      *(undefined8 *)((long)&((endpoint *)e1->m_bits)->data_ + 0xc) =
           *(undefined8 *)((long)&(k->impl_).data_ + 0xc);
      *(undefined8 *)((long)&((endpoint *)e1->m_bits)->data_ + 0x14) = uVar3;
      *(undefined8 *)&((endpoint *)e1->m_bits)->data_ = uVar1;
      *(undefined8 *)((long)&((endpoint *)e1->m_bits)->data_ + 8) = uVar2;
      *(IConnection **)((long)((endpoint *)e1->m_bits + 1) + 4) = *v;
      *(undefined1 *)((long)((endpoint *)e1->m_bits + 1) + 0xc) = 1;
      this->m_num_valid = this->m_num_valid + 1;
      goto LAB_0014a025;
    }
    bVar4 = asio::ip::operator==((basic_endpoint<asio::ip::udp> *)e1,k);
    if (bVar4) {
LAB_00149f8a:
      uVar6 = 0;
      goto LAB_0014a025;
    }
    do {
      if ((int)uVar8 == 0) {
        uVar8 = (ulong)(this->m_values_count - 1);
        e1 = this->m_values + uVar8;
      }
      else {
        uVar8 = (ulong)((int)uVar8 - 1);
        e1 = e1 + -1;
      }
      uVar7 = (uint)uVar8;
      if (uVar9 == uVar7) goto LAB_00149f2d;
      if (e1->m_bits[0x28] == '\0') goto LAB_00149f21;
      bVar4 = asio::ip::operator==((basic_endpoint<asio::ip::udp> *)e1,k);
    } while (!bVar4);
LAB_00149fd4:
    uVar6 = 0;
    uVar8 = (ulong)uVar7;
  }
LAB_0014a025:
  return (insert_result)(uVar8 | uVar6);
}

Assistant:

inline insert_result insert(const Key& k, const Value& v = Value())
    {
        insert_result result;
        if (!insert_no_grow(result, k, v))
        {
            unsigned newSize = m_values_count * 2;
            if (newSize < cMinHashSize) {
                newSize = cMinHashSize;
            }

            rehash(newSize);

            if (!insert_no_grow(result, k, v)) {
                TONK_DEBUG_BREAK();
            }
        }

        return result;
    }